

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# xmlIO.c
# Opt level: O0

void * xmlIOHTTPOpenW(char *post_uri,int compression)

{
  xmlChar *pxVar1;
  void *pvVar2;
  xmlOutputBufferPtr pxVar3;
  xmlIOHTTPWriteCtxtPtr local_28;
  xmlIOHTTPWriteCtxtPtr ctxt;
  int compression_local;
  char *post_uri_local;
  
  if (post_uri == (char *)0x0) {
    post_uri_local = (char *)0x0;
  }
  else {
    local_28 = (xmlIOHTTPWriteCtxtPtr)(*xmlMalloc)(0x18);
    if (local_28 == (xmlIOHTTPWriteCtxtPtr)0x0) {
      xmlIOErrMemory("creating HTTP output context");
      post_uri_local = (char *)0x0;
    }
    else {
      memset(local_28,0,0x18);
      pxVar1 = xmlStrdup((xmlChar *)post_uri);
      local_28->uri = (char *)pxVar1;
      if (local_28->uri == (char *)0x0) {
        xmlIOErrMemory("copying URI");
        xmlFreeHTTPWriteCtxt(local_28);
        post_uri_local = (char *)0x0;
      }
      else {
        if ((compression < 1) || (9 < compression)) {
          pxVar3 = xmlAllocOutputBufferInternal((xmlCharEncodingHandlerPtr)0x0);
          local_28->doc_buff = pxVar3;
        }
        else {
          local_28->compression = compression;
          pvVar2 = xmlCreateZMemBuff(compression);
          local_28->doc_buff = pvVar2;
        }
        if (local_28->doc_buff == (void *)0x0) {
          xmlFreeHTTPWriteCtxt(local_28);
          local_28 = (xmlIOHTTPWriteCtxtPtr)0x0;
        }
        post_uri_local = (char *)local_28;
      }
    }
  }
  return post_uri_local;
}

Assistant:

void *
xmlIOHTTPOpenW(const char *post_uri, int compression ATTRIBUTE_UNUSED)
{

    xmlIOHTTPWriteCtxtPtr ctxt = NULL;

    if (post_uri == NULL)
        return (NULL);

    ctxt = xmlMalloc(sizeof(xmlIOHTTPWriteCtxt));
    if (ctxt == NULL) {
	xmlIOErrMemory("creating HTTP output context");
        return (NULL);
    }

    (void) memset(ctxt, 0, sizeof(xmlIOHTTPWriteCtxt));

    ctxt->uri = (char *) xmlStrdup((const xmlChar *)post_uri);
    if (ctxt->uri == NULL) {
	xmlIOErrMemory("copying URI");
        xmlFreeHTTPWriteCtxt(ctxt);
        return (NULL);
    }

    /*
     * **  Since the document length is required for an HTTP post,
     * **  need to put the document into a buffer.  A memory buffer
     * **  is being used to avoid pushing the data to disk and back.
     */

#ifdef LIBXML_ZLIB_ENABLED
    if ((compression > 0) && (compression <= 9)) {

        ctxt->compression = compression;
        ctxt->doc_buff = xmlCreateZMemBuff(compression);
    } else
#endif
    {
        /*  Any character conversions should have been done before this  */

        ctxt->doc_buff = xmlAllocOutputBufferInternal(NULL);
    }

    if (ctxt->doc_buff == NULL) {
        xmlFreeHTTPWriteCtxt(ctxt);
        ctxt = NULL;
    }

    return (ctxt);
}